

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void anon_unknown.dwarf_13465d::ClearLoadStoreInfoGlobal(VmModule *module)

{
  uint uVar1;
  VariableData *pVVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  LoadStoreInfo *pLVar6;
  LoadStoreInfo *pLVar7;
  ulong uVar8;
  byte bVar9;
  
  bVar9 = 0;
  if ((module->loadStoreInfo).count != 0) {
    uVar8 = 0;
    do {
      pLVar7 = (module->loadStoreInfo).data;
      if ((pLVar7[uVar8].loadAddress == (VmConstant *)0x0) ||
         (pVVar2 = (pLVar7[uVar8].loadAddress)->container, pVVar2 == (VariableData *)0x0)) {
        bVar3 = false;
      }
      else {
        bVar3 = IsGlobalScope(pVVar2->scope);
      }
      if ((pLVar7[uVar8].storeAddress == (VmConstant *)0x0) ||
         (pVVar2 = (pLVar7[uVar8].storeAddress)->container, pVVar2 == (VariableData *)0x0)) {
        bVar4 = false;
      }
      else {
        bVar4 = IsGlobalScope(pVVar2->scope);
      }
      if ((bVar3 != false) && (pLVar7[uVar8].noLoadOrNoContainerAlias == true)) {
        bVar3 = (bool)(bVar3 & ((pLVar7[uVar8].loadAddress)->container->isAlloca ^ 1U));
      }
      if ((bVar4 != false) && (pLVar7[uVar8].noStoreOrNoContainerAlias == true)) {
        bVar4 = (bool)(bVar4 & ((pLVar7[uVar8].storeAddress)->container->isAlloca ^ 1U));
      }
      if ((bVar3 | bVar4) == 1) {
        uVar1 = (module->loadStoreInfo).count;
        if (uVar1 == 0) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x172,
                        "T &SmallArray<VmModule::LoadStoreInfo, 32>::back() [T = VmModule::LoadStoreInfo, N = 32]"
                       );
        }
        if (uVar1 <= (uint)uVar8) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmModule::LoadStoreInfo, 32>::operator[](unsigned int) [T = VmModule::LoadStoreInfo, N = 32]"
                       );
        }
        pLVar7 = (module->loadStoreInfo).data;
        bVar3 = pLVar7[uVar1 - 1].noStoreOrNoContainerAlias;
        pLVar7[uVar8].noLoadOrNoContainerAlias = pLVar7[uVar1 - 1].noLoadOrNoContainerAlias;
        pLVar7[uVar8].noStoreOrNoContainerAlias = bVar3;
        pLVar6 = pLVar7 + (uVar1 - 1);
        pLVar7 = pLVar7 + uVar8;
        for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
          pLVar7->loadInst = pLVar6->loadInst;
          pLVar6 = (LoadStoreInfo *)((long)pLVar6 + ((ulong)bVar9 * -2 + 1) * 8);
          pLVar7 = (LoadStoreInfo *)((long)pLVar7 + ((ulong)bVar9 * -2 + 1) * 8);
        }
        uVar1 = (module->loadStoreInfo).count;
        if (uVar1 == 0) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x183,
                        "void SmallArray<VmModule::LoadStoreInfo, 32>::pop_back() [T = VmModule::LoadStoreInfo, N = 32]"
                       );
        }
        (module->loadStoreInfo).count = uVar1 - 1;
      }
      else {
        uVar8 = (ulong)((uint)uVar8 + 1);
      }
    } while ((uint)uVar8 < (module->loadStoreInfo).count);
  }
  return;
}

Assistant:

void ClearLoadStoreInfoGlobal(VmModule *module)
	{
		for(unsigned i = 0; i < module->loadStoreInfo.size();)
		{
			VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

			bool hasLoadFromGlobal = el.loadAddress && el.loadAddress->container && IsGlobalScope(el.loadAddress->container->scope);
			bool hasStoreToGlobal = el.storeAddress && el.storeAddress->container && IsGlobalScope(el.storeAddress->container->scope);

			// If this is an alloca temporary and it cannot be aliased, we can remove it even in the global scope
			if(hasLoadFromGlobal && el.noLoadOrNoContainerAlias && el.loadAddress->container->isAlloca)
				hasLoadFromGlobal = false;

			if(hasStoreToGlobal && el.noStoreOrNoContainerAlias && el.storeAddress->container->isAlloca)
				hasStoreToGlobal = false;

			if(hasLoadFromGlobal || hasStoreToGlobal)
			{
				module->loadStoreInfo[i] = module->loadStoreInfo.back();
				module->loadStoreInfo.pop_back();
			}
			else
			{
				i++;
				continue;
			}
		}
	}